

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O3

bool __thiscall sf::priv::WindowImpl::popEvent(WindowImpl *this,Event *event,bool block)

{
  undefined8 uVar1;
  Time TVar2;
  _Elt_pointer pEVar3;
  _Elt_pointer pEVar4;
  
  pEVar4 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pEVar3 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pEVar3 == pEVar4) {
    processJoystickEvents(this);
    processSensorEvents(this);
    (*this->_vptr_WindowImpl[0x10])(this);
    pEVar4 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pEVar3 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pEVar3 == pEVar4 && block) {
      do {
        TVar2 = milliseconds(10);
        sleep((uint)TVar2.m_microseconds);
        processJoystickEvents(this);
        processSensorEvents(this);
        (*this->_vptr_WindowImpl[0x10])(this);
        pEVar4 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl
                 .super__Deque_impl_data._M_start._M_cur;
        pEVar3 = (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl
                 .super__Deque_impl_data._M_finish._M_cur;
      } while (pEVar3 == pEVar4);
    }
  }
  if (pEVar3 != pEVar4) {
    (event->field_1).mouseWheelScroll.y = (pEVar4->field_1).mouseWheelScroll.y;
    uVar1 = *(undefined8 *)((long)&pEVar4->field_1 + 4);
    *(undefined8 *)event = *(undefined8 *)pEVar4;
    *(undefined8 *)((long)&event->field_1 + 4) = uVar1;
    std::deque<sf::Event,_std::allocator<sf::Event>_>::pop_front(&(this->m_events).c);
  }
  return pEVar3 != pEVar4;
}

Assistant:

bool WindowImpl::popEvent(Event& event, bool block)
{
    // If the event queue is empty, let's first check if new events are available from the OS
    if (m_events.empty())
    {
        // Get events from the system
        processJoystickEvents();
        processSensorEvents();
        processEvents();

        // In blocking mode, we must process events until one is triggered
        if (block)
        {
            // Here we use a manual wait loop instead of the optimized
            // wait-event provided by the OS, so that we don't skip joystick
            // events (which require polling)
            while (m_events.empty())
            {
                sleep(milliseconds(10));
                processJoystickEvents();
                processSensorEvents();
                processEvents();
            }
        }
    }

    // Pop the first event of the queue, if it is not empty
    if (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop();

        return true;
    }

    return false;
}